

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

void __thiscall minihttp::HttpSocket::_OnData(HttpSocket *this)

{
  byte bVar1;
  uint uVar2;
  int __fd;
  
  bVar1 = this->_chunkedTransfer;
  if (((bool)bVar1 == false) &&
     ((this->_remaining == 0 || ((this->super_TcpSocket)._recvSize == 0)))) {
    _ParseHeader(this);
    bVar1 = this->_chunkedTransfer;
  }
  if ((bVar1 & 1) != 0) {
    _ProcessChunk(this);
    return;
  }
  if ((this->_remaining == 0) || (uVar2 = (this->super_TcpSocket)._recvSize, uVar2 == 0)) {
    return;
  }
  uVar2 = this->_remaining - uVar2;
  this->_remaining = uVar2;
  __fd = (int)(this->super_TcpSocket)._readptr;
  if ((this->_status - 200 < 6) || (this->_alwaysHandle == true)) {
    (*(this->super_TcpSocket)._vptr_TcpSocket[5])(this);
    uVar2 = this->_remaining;
  }
  if ((int)uVar2 < 0) {
    this->_remaining = 0;
  }
  else if (uVar2 != 0) {
    return;
  }
  if (this->_mustClose != true) {
    _DequeueMore(this);
    return;
  }
  TcpSocket::close(&this->super_TcpSocket,__fd);
  return;
}

Assistant:

void HttpSocket::_OnData(void)
{
    if(!(_chunkedTransfer || (_remaining && _recvSize)))
        _ParseHeader();

    if(_chunkedTransfer)
    {
        _ProcessChunk(); // first, try to finish one or more chunks
    }
    else if(_remaining && _recvSize) // something remaining? if so, we got a header earlier, but not all data
    {
        _remaining -= _recvSize;
        _OnRecvInternal(_readptr, _recvSize);

        if(int(_remaining) < 0)
        {
            traceprint("_OnRecv: _remaining wrap-around, huh??\n");
            _remaining = 0;
        }
        if(!_remaining) // received last block?
        {
            if(_mustClose)
                close();
            else
                _DequeueMore();
        }

        // nothing else to do here.
    }

    // otherwise, the server sent just the header, with the data following in the next packet
}